

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O1

void __thiscall despot::DESPOT::Compare(DESPOT *this)

{
  Belief *pBVar1;
  VNode *this_00;
  double dVar2;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  RandomStreams streams;
  SearchStatistics statistics;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_b0;
  RandomStreams local_98;
  SearchStatistics local_78;
  
  pBVar1 = (this->super_Solver).belief_;
  (*pBVar1->_vptr_Belief[2])(&local_b0,pBVar1,(ulong)(uint)DAT_00193ddc);
  SearchStatistics::SearchStatistics(&local_78);
  RandomStreams::RandomStreams(&local_98,DAT_00193ddc,DAT_00193de0);
  this_00 = ConstructTree(&local_b0,&local_98,this->lower_bound_,this->upper_bound_,
                          (this->super_Solver).model_,&(this->super_Solver).history_,Globals::config
                          ,&local_78);
  dVar2 = VNode::lower_bound(this_00);
  CheckDESPOT(this,this_00,dVar2);
  dVar2 = VNode::lower_bound(this_00);
  CheckDESPOTSTAR(this,this_00,dVar2);
  VNode::~VNode(this_00);
  operator_delete(this_00,0x98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_98.streams_);
  if (local_b0.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DESPOT::Compare() {
	vector<State*> particles = belief_->Sample(Globals::config.num_scenarios);
	SearchStatistics statistics;

	RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	VNode* root = ConstructTree(particles, streams, lower_bound_, upper_bound_,
		model_, history_, Globals::config.time_per_move, &statistics);

	CheckDESPOT(root, root->lower_bound());
	CheckDESPOTSTAR(root, root->lower_bound());
	delete root;
}